

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

char * sanitize_cookie_path(char *cookie_path)

{
  size_t sVar1;
  char *new_path;
  size_t len;
  char *cookie_path_local;
  
  cookie_path_local = (*Curl_cstrdup)(cookie_path);
  if (cookie_path_local == (char *)0x0) {
    cookie_path_local = (char *)0x0;
  }
  else {
    if (*cookie_path_local == '\"') {
      sVar1 = strlen(cookie_path_local);
      memmove(cookie_path_local,cookie_path_local + 1,sVar1);
    }
    sVar1 = strlen(cookie_path_local);
    if (cookie_path_local[sVar1 - 1] == '\"') {
      sVar1 = strlen(cookie_path_local);
      cookie_path_local[sVar1 - 1] = '\0';
    }
    if (*cookie_path_local == '/') {
      sVar1 = strlen(cookie_path_local);
      if ((1 < sVar1) && (cookie_path_local[sVar1 - 1] == '/')) {
        cookie_path_local[sVar1 - 1] = '\0';
      }
    }
    else {
      (*Curl_cfree)(cookie_path_local);
      cookie_path_local = (*Curl_cstrdup)("/");
    }
  }
  return cookie_path_local;
}

Assistant:

static char *sanitize_cookie_path(const char *cookie_path)
{
  size_t len;
  char *new_path = strdup(cookie_path);
  if(!new_path)
    return NULL;

  /* some stupid site sends path attribute with '"'. */
  if(new_path[0] == '\"') {
    memmove((void *)new_path, (const void *)(new_path + 1), strlen(new_path));
  }
  if(new_path[strlen(new_path) - 1] == '\"') {
    new_path[strlen(new_path) - 1] = 0x0;
  }

  /* RFC6265 5.2.4 The Path Attribute */
  if(new_path[0] != '/') {
    /* Let cookie-path be the default-path. */
    free(new_path);
    new_path = strdup("/");
    return new_path;
  }

  /* convert /hoge/ to /hoge */
  len = strlen(new_path);
  if(1 < len && new_path[len - 1] == '/') {
    new_path[len - 1] = 0x0;
  }

  return new_path;
}